

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O0

int ffukls(fitsfile *fptr,char *keyname,char *value,char *comm,int *status)

{
  int iVar1;
  int iVar2;
  int *in_R8;
  char junk [81];
  int tstatus;
  int *in_stack_00000140;
  char *in_stack_00000148;
  char *in_stack_00000150;
  char *in_stack_00000158;
  fitsfile *in_stack_00000160;
  int *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  fitsfile *in_stack_ffffffffffffff98;
  undefined4 local_4;
  
  if (*in_R8 < 1) {
    iVar1 = *in_R8;
    iVar2 = ffmkls(in_stack_00000160,in_stack_00000158,in_stack_00000150,in_stack_00000148,
                   in_stack_00000140);
    if (iVar2 == 0xca) {
      ffgmsg((char *)0x200712);
      *in_R8 = iVar1;
      ffpkls(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    local_4 = *in_R8;
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int ffukls(fitsfile *fptr,      /* I - FITS file pointer  */
           const char *keyname, /* I - keyword name       */
           const char *value,   /* I - keyword value      */
           const char *comm,    /* I - keyword comment    */
           int *status)         /* IO - error status      */ 
{
    /* update a long string keyword */

    int tstatus;
    char junk[FLEN_ERRMSG];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    tstatus = *status;

    if (ffmkls(fptr, keyname, value, comm, status) == KEY_NO_EXIST)
    {
        /* since the ffmkls call failed, it wrote a bogus error message */
        fits_read_errmsg(junk);  /* clear the error message */
	
        *status = tstatus;
        ffpkls(fptr, keyname, value, comm, status);
    }
    return(*status);
}